

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

bool __thiscall
llvm::cl::opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_>::handleOccurrence
          (opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_> *this,uint pos,
          StringRef ArgName,StringRef Arg)

{
  bool bVar1;
  parser_data_type_conflict1 Val;
  uint local_14;
  
  local_14 = 0;
  bVar1 = parser<unsigned_int>::parse
                    ((parser<unsigned_int> *)this,&this->super_Option,ArgName,Arg,&local_14);
  if (!bVar1) {
    *(uint *)&this->super_opt_storage<unsigned_int,_false,_false> = local_14;
    (this->super_Option).Position = pos;
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }